

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STExchange.h
# Opt level: O3

void jbcoin::set<jbcoin::STBlob,jbcoin::Buffer>
               (STObject *st,TypedField<jbcoin::STBlob> *f,Buffer *t)

{
  _Head_base<0UL,_unsigned_char_*,_false> _Var1;
  size_t sVar2;
  tuple<jbcoin::STBase_*,_std::default_delete<jbcoin::STBase>_> tVar3;
  pointer *__ptr;
  __uniq_ptr_impl<jbcoin::STBase,_std::default_delete<jbcoin::STBase>_> local_28;
  
  tVar3.super__Tuple_impl<0UL,_jbcoin::STBase_*,_std::default_delete<jbcoin::STBase>_>.
  super__Head_base<0UL,_jbcoin::STBase_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_jbcoin::STBase_*,_std::default_delete<jbcoin::STBase>_>)operator_new(0x20);
  *(TypedField<jbcoin::STBlob> **)
   ((long)tVar3.super__Tuple_impl<0UL,_jbcoin::STBase_*,_std::default_delete<jbcoin::STBase>_>.
          super__Head_base<0UL,_jbcoin::STBase_*,_false>._M_head_impl + 8) = f;
  *(undefined ***)
   tVar3.super__Tuple_impl<0UL,_jbcoin::STBase_*,_std::default_delete<jbcoin::STBase>_>.
   super__Head_base<0UL,_jbcoin::STBase_*,_false>._M_head_impl = &PTR__STBlob_002d30a8;
  _Var1._M_head_impl =
       (t->p_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
       .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  sVar2 = t->size_;
  (t->p_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  *(uchar **)
   ((long)tVar3.super__Tuple_impl<0UL,_jbcoin::STBase_*,_std::default_delete<jbcoin::STBase>_>.
          super__Head_base<0UL,_jbcoin::STBase_*,_false>._M_head_impl + 0x10) = _Var1._M_head_impl;
  *(size_t *)
   ((long)tVar3.super__Tuple_impl<0UL,_jbcoin::STBase_*,_std::default_delete<jbcoin::STBase>_>.
          super__Head_base<0UL,_jbcoin::STBase_*,_false>._M_head_impl + 0x18) = sVar2;
  t->size_ = 0;
  local_28._M_t.super__Tuple_impl<0UL,_jbcoin::STBase_*,_std::default_delete<jbcoin::STBase>_>.
  super__Head_base<0UL,_jbcoin::STBase_*,_false>._M_head_impl =
       (tuple<jbcoin::STBase_*,_std::default_delete<jbcoin::STBase>_>)
       (tuple<jbcoin::STBase_*,_std::default_delete<jbcoin::STBase>_>)
       tVar3.super__Tuple_impl<0UL,_jbcoin::STBase_*,_std::default_delete<jbcoin::STBase>_>.
       super__Head_base<0UL,_jbcoin::STBase_*,_false>._M_head_impl;
  STObject::set(st,(unique_ptr<jbcoin::STBase,_std::default_delete<jbcoin::STBase>_> *)&local_28);
  (**(code **)(*(long *)tVar3.
                        super__Tuple_impl<0UL,_jbcoin::STBase_*,_std::default_delete<jbcoin::STBase>_>
                        .super__Head_base<0UL,_jbcoin::STBase_*,_false>._M_head_impl + 8))
            (tVar3.super__Tuple_impl<0UL,_jbcoin::STBase_*,_std::default_delete<jbcoin::STBase>_>.
             super__Head_base<0UL,_jbcoin::STBase_*,_false>._M_head_impl);
  return;
}

Assistant:

void
set (STObject& st,
    TypedField<U> const& f, T&& t)
{
    st.set(STExchange<U,
        typename std::decay<T>::type>::set(
            f, std::forward<T>(t)));
}